

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch2.h
# Opt level: O0

bool testSeed<unsigned_short>
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *keys,SeedType *seed,
               size_t n1,size_t n2,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *vals,string *hash_str,string *map_name,string *default_value,bool nonKeyLookups)

{
  bool bVar1;
  uint32_t uVar2;
  reference pvVar3;
  reference __x;
  iterator iVar4;
  iterator iVar5;
  size_type sVar6;
  string local_158;
  vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> local_138;
  reference local_120;
  Bin<unsigned_short> *bin;
  iterator __end0_1;
  iterator __begin0_1;
  vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> *__range1_1;
  undefined1 local_f8 [8];
  vector<bool,_std::allocator<bool>_> final_layer;
  size_t max_keys1;
  uint32_t h;
  unsigned_short *key;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  size_t i;
  allocator<Bin<unsigned_short>_> local_61;
  undefined1 local_60 [8];
  vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> layer1;
  bool nonKeyLookups_local;
  string *hash_str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vals_local;
  size_t n2_local;
  size_t n1_local;
  SeedType *seed_local;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *keys_local;
  
  layer1.super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = nonKeyLookups;
  std::allocator<Bin<unsigned_short>_>::allocator(&local_61);
  std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::vector
            ((vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> *)local_60,n1 + 1,
             &local_61);
  std::allocator<Bin<unsigned_short>_>::~allocator(&local_61);
  for (__range1 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x0; __range1 <= n1;
      __range1 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 ((long)&(__range1->
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1)) {
    pvVar3 = std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::operator[]
                       ((vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> *)
                        local_60,(size_type)__range1);
    pvVar3->generating_hash = (uint32_t)__range1;
  }
  __end0 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(keys);
  key = (unsigned_short *)std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(keys);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                *)&key);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
          ::operator*(&__end0);
    uVar2 = hash2((ulong)*__x,seed);
    n2_local._0_4_ = (uint)n1;
    pvVar3 = std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::operator[]
                       ((vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> *)
                        local_60,(ulong)(uVar2 & (uint)n2_local));
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(&pvVar3->keys,__x);
    __gnu_cxx::
    __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&__end0);
  }
  iVar4 = std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::begin
                    ((vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> *)local_60)
  ;
  iVar5 = std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::end
                    ((vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> *)local_60)
  ;
  std::
  sort<__gnu_cxx::__normal_iterator<Bin<unsigned_short>*,std::vector<Bin<unsigned_short>,std::allocator<Bin<unsigned_short>>>>,testSeed<unsigned_short>(std::vector<unsigned_short,std::allocator<unsigned_short>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>
            (iVar4._M_current,iVar5._M_current);
  pvVar3 = std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::operator[]
                     ((vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> *)local_60
                      ,0);
  sVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&pvVar3->keys);
  if (sVar6 == 1) {
    keys_local._7_1_ = true;
    final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage._4_4_ = 1;
  }
  else {
    pvVar3 = std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::operator[]
                       ((vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> *)
                        local_60,0);
    sVar6 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&pvVar3->keys);
    if (sVar6 < 10) {
      __range1_1._7_1_ = 0;
      std::allocator<bool>::allocator((allocator<bool> *)((long)&__range1_1 + 6));
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_f8,n2 + 1,
                 (bool *)((long)&__range1_1 + 7),(allocator<bool> *)((long)&__range1_1 + 6));
      std::allocator<bool>::~allocator((allocator<bool> *)((long)&__range1_1 + 6));
      __end0_1 = std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::begin
                           ((vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> *)
                            local_60);
      bin = (Bin<unsigned_short> *)
            std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::end
                      ((vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> *)
                       local_60);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end0_1,
                           (__normal_iterator<Bin<unsigned_short>_*,_std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>_>
                            *)&bin);
        if (!bVar1) break;
        local_120 = __gnu_cxx::
                    __normal_iterator<Bin<unsigned_short>_*,_std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>_>
                    ::operator*(&__end0_1);
        bVar1 = findSeed<unsigned_short>
                          (local_120,n2,(vector<bool,_std::allocator<bool>_> *)local_f8);
        if (!bVar1) {
          keys_local._7_1_ = false;
          goto LAB_0011046a;
        }
        __gnu_cxx::
        __normal_iterator<Bin<unsigned_short>_*,_std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>_>
        ::operator++(&__end0_1);
      }
      std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::vector
                (&local_138,
                 (vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> *)local_60);
      std::__cxx11::string::string((string *)&local_158,(string *)map_name);
      writeHash2<unsigned_short>
                (keys,seed,n1,n2,vals,&local_138,hash_str,&local_158,default_value,
                 (bool)(layer1.
                        super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
      std::__cxx11::string::~string((string *)&local_158);
      std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::~vector(&local_138);
      keys_local._7_1_ = true;
LAB_0011046a:
      final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage._4_4_ = 1;
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_f8);
    }
    else {
      keys_local._7_1_ = false;
      final_layer.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage._4_4_ = 1;
    }
  }
  std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::~vector
            ((vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> *)local_60);
  return keys_local._7_1_;
}

Assistant:

static bool testSeed(const std::vector<KeyType>& keys,
                     const SeedType& seed,
                     size_t n1,
                     size_t n2,
                     const std::vector<std::string>& vals,
                     std::string& hash_str,
                     std::string map_name,
                     const std::string& default_value,
                     bool nonKeyLookups){
    std::vector<Bin<KeyType>> layer1(n1+1);
    for(size_t i = 0; i <= n1; i++) layer1[i].generating_hash = i;

    for(const KeyType& key : keys){
        const uint32_t h = hash2(key, seed) & n1;
        layer1[h].keys.push_back(key);
    }

    struct LayerSort{
        inline bool operator() (const Bin<KeyType>& a, const Bin<KeyType>& b){
            return (a.keys.size() > b.keys.size());
        }
    };
    std::sort(layer1.begin(), layer1.end(), LayerSort());

    const size_t max_keys1 = 10;

    if(layer1[0].keys.size() == 1) return true;
    else if(layer1[0].keys.size() >= max_keys1) return false;

    std::vector<bool> final_layer(n2+1, false);

    for(auto& bin : layer1)
        if(!findSeed<KeyType>(bin, n2, final_layer)) return false;

    writeHash2<KeyType>(keys, seed, n1, n2, vals, layer1, hash_str, map_name, default_value, nonKeyLookups);
    return true;
}